

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

void Of_StoDelete(Of_Man_t *p)

{
  void **__ptr;
  Vec_Mem_t *pVVar1;
  word *__ptr_00;
  void *__ptr_01;
  int i;
  int i_00;
  int i_1;
  long lVar2;
  
  for (i_00 = 0; i_00 < (p->vPages).nSize; i_00 = i_00 + 1) {
    __ptr_01 = Vec_PtrEntry(&p->vPages,i_00);
    if ((void *)0x2 < __ptr_01) {
      free(__ptr_01);
    }
  }
  __ptr = (p->vPages).pArray;
  if (__ptr != (void **)0x0) {
    free(__ptr);
    (p->vPages).pArray = (void **)0x0;
  }
  (p->vPages).nCap = 0;
  (p->vPages).nSize = 0;
  Vec_IntErase(&p->vCutSets);
  Vec_IntErase(&p->vCutFlows);
  Vec_IntErase(&p->vCutDelays);
  Vec_IntErase(&p->vCutRefs);
  if (p->pObjs != (Of_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Of_Obj_t *)0x0;
  }
  if (p->pPars->fCutMin != 0) {
    pVVar1 = p->vTtMem;
    if (pVVar1 != (Vec_Mem_t *)0x0) {
      Vec_IntFreeP(&pVVar1->vTable);
      Vec_IntFreeP(&pVVar1->vNexts);
      if (p->pPars->fCutMin == 0) goto LAB_00610b8f;
    }
    pVVar1 = p->vTtMem;
    for (lVar2 = 0; lVar2 <= pVVar1->iPage; lVar2 = lVar2 + 1) {
      __ptr_00 = pVVar1->ppPages[lVar2];
      if (__ptr_00 != (word *)0x0) {
        free(__ptr_00);
        pVVar1->ppPages[lVar2] = (word *)0x0;
      }
    }
    free(pVVar1->ppPages);
    free(pVVar1);
  }
LAB_00610b8f:
  free(p);
  return;
}

Assistant:

void Of_StoDelete( Of_Man_t * p )
{
    Vec_PtrFreeData( &p->vPages );
    Vec_PtrErase( &p->vPages );
    Vec_IntErase( &p->vCutSets );
    Vec_IntErase( &p->vCutFlows );
    Vec_IntErase( &p->vCutDelays );
    Vec_IntErase( &p->vCutRefs );
    ABC_FREE( p->pObjs );
    // matching
    if ( p->pPars->fCutMin )
        Vec_MemHashFree( p->vTtMem );
    if ( p->pPars->fCutMin )
        Vec_MemFree( p->vTtMem );
    ABC_FREE( p );
}